

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O0

void Block4Stream_Close(TBlockStream *pStream)

{
  void *pvVar1;
  uint local_1c;
  DWORD i;
  TBaseProviderData *BaseArray;
  TBlockStream *pStream_local;
  
  pvVar1 = pStream->FileBitmap;
  if (pvVar1 != (void *)0x0) {
    for (local_1c = 0; local_1c < pStream->BitmapSize; local_1c = local_1c + 1) {
      memcpy(&(pStream->super_TFileStream).Base,(void *)((long)pvVar1 + (ulong)local_1c * 0x28),0x28
            );
      (*(pStream->super_TFileStream).BaseClose)(&pStream->super_TFileStream);
    }
  }
  if (pStream->FileBitmap != (void *)0x0) {
    free(pStream->FileBitmap);
  }
  pStream->FileBitmap = (void *)0x0;
  return;
}

Assistant:

static void Block4Stream_Close(TBlockStream * pStream)
{
    TBaseProviderData * BaseArray = (TBaseProviderData *)pStream->FileBitmap;

    // If we have a non-zero count of base streams,
    // we have to close them all
    if(BaseArray != NULL)
    {
        // Close all base streams
        for(DWORD i = 0; i < pStream->BitmapSize; i++)
        {
            memcpy(&pStream->Base, BaseArray + i, sizeof(TBaseProviderData));
            pStream->BaseClose(pStream);
        }
    }

    // Free the data map, if any
    if(pStream->FileBitmap != NULL)
        CASC_FREE(pStream->FileBitmap);
    pStream->FileBitmap = NULL;

    // Do not call the BaseClose function,
    // we closed all handles already
    return;
}